

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

bool __thiscall cmCTestTestHandler::ComputeTestList(cmCTestTestHandler *this)

{
  cmCTestTestProperties *pcVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  bool bVar6;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  cmCTestTestProperties *this_00;
  long lVar8;
  iterator __end1;
  iterator __begin1;
  cmCTestTestProperties *pcVar9;
  pointer __x;
  int inREcnt;
  int cnt;
  ListOfTests finalList;
  string last_directory;
  int local_70;
  int local_6c;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  local_68;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pcVar9 = (this->TestList).
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->TestList).
           super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pcVar9;
  if (pcVar1 != pcVar9) {
    do {
      cmCTestTestProperties::~cmCTestTestProperties(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pcVar1);
    (this->TestList).
    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar9;
  }
  bVar6 = GetListOfTests(this);
  if (bVar6) {
    if (this->RerunFailed == true) {
      ComputeTestListForRerunFailed(this);
    }
    else {
      pcVar9 = (this->TestList).
               super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar1 = (this->TestList).
               super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = (long)pcVar1 - (long)pcVar9;
      local_70 = 0;
      for (; pcVar1 != pcVar9; pcVar9 = pcVar9 + 1) {
        CheckLabelFilterInclude(this,pcVar9);
        CheckLabelFilterExclude(this,pcVar9);
        if (pcVar9->IsInBasedOnREOptions == true) {
          local_70 = local_70 + 1;
        }
      }
      iVar5 = (int)((ulong)lVar8 >> 8) * -0x55555555;
      if (this->UseUnion == false) {
        iVar5 = local_70;
      }
      ExpandTestsToRunInformation(this,(long)iVar5);
      local_6c = 0;
      local_70 = 0;
      local_50 = &local_40;
      local_48 = 0;
      local_40 = 0;
      local_68.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __x = (this->TestList).
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = (this->TestList).
               super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__x != pcVar2) {
        do {
          local_6c = local_6c + 1;
          if (__x->IsInBasedOnREOptions == true) {
            local_70 = local_70 + 1;
          }
          if (this->UseUnion == true) {
            piVar3 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar4 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (((piVar3 == piVar4) ||
                (_Var7 = std::
                         __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                   (piVar3,piVar4,&local_6c),
                _Var7._M_current !=
                (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish)) || (__x->IsInBasedOnREOptions != false)) {
LAB_0016a9aa:
              __x->Index = local_6c;
              std::
              vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
              ::push_back(&local_68,__x);
            }
          }
          else {
            piVar3 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar4 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (((piVar3 == piVar4) ||
                (_Var7 = std::
                         __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                   (piVar3,piVar4,&local_70),
                _Var7._M_current !=
                (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish)) && (__x->IsInBasedOnREOptions == true))
            goto LAB_0016a9aa;
          }
          __x = __x + 1;
        } while (__x != pcVar2);
      }
      UpdateForFixtures(this,&local_68);
      this->TotalNumberOfTests =
           ((long)(this->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 8) * -0x5555555555555555;
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::operator=(&this->TestList,&local_68);
      UpdateMaxTestNameWidth(this);
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::~vector(&local_68);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    }
  }
  return bVar6;
}

Assistant:

bool cmCTestTestHandler::ComputeTestList()
{
  this->TestList.clear(); // clear list of test
  if (!this->GetListOfTests()) {
    return false;
  }

  if (this->RerunFailed) {
    this->ComputeTestListForRerunFailed();
    return true;
  }

  cmCTestTestHandler::ListOfTests::size_type tmsize = this->TestList.size();
  // how many tests are in based on RegExp?
  int inREcnt = 0;
  for (cmCTestTestProperties& tp : this->TestList) {
    this->CheckLabelFilter(tp);
    if (tp.IsInBasedOnREOptions) {
      inREcnt++;
    }
  }
  // expand the test list based on the union flag
  if (this->UseUnion) {
    this->ExpandTestsToRunInformation(static_cast<int>(tmsize));
  } else {
    this->ExpandTestsToRunInformation(inREcnt);
  }
  // Now create a final list of tests to run
  int cnt = 0;
  inREcnt = 0;
  std::string last_directory;
  ListOfTests finalList;
  for (cmCTestTestProperties& tp : this->TestList) {
    cnt++;
    if (tp.IsInBasedOnREOptions) {
      inREcnt++;
    }

    if (this->UseUnion) {
      // if it is not in the list and not in the regexp then skip
      if ((!this->TestsToRun.empty() &&
           !cm::contains(this->TestsToRun, cnt)) &&
          !tp.IsInBasedOnREOptions) {
        continue;
      }
    } else {
      // is this test in the list of tests to run? If not then skip it
      if ((!this->TestsToRun.empty() &&
           !cm::contains(this->TestsToRun, inREcnt)) ||
          !tp.IsInBasedOnREOptions) {
        continue;
      }
    }
    tp.Index = cnt; // save the index into the test list for this test
    finalList.push_back(tp);
  }

  this->UpdateForFixtures(finalList);

  // Save the total number of tests before exclusions
  this->TotalNumberOfTests = this->TestList.size();
  // Set the TestList to the final list of all test
  this->TestList = finalList;

  this->UpdateMaxTestNameWidth();
  return true;
}